

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAgi.c
# Opt level: O3

int Agi_ManSuppSize_rec(Agi_Man_t *p,int i)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  word *pwVar4;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  
  uVar7 = (ulong)i;
  uVar2 = p->nTravIds;
  iVar6 = 0;
  if (p->pTravIds[uVar7] != uVar2) {
    puVar5 = p->pTravIds + uVar7;
    pwVar4 = p->pObjs;
    iVar6 = 0;
    do {
      *puVar5 = uVar2;
      uVar1 = pwVar4[uVar7];
      uVar2 = (uint)(uVar1 >> 0x20);
      if (0x7ffffffe < uVar2 >> 1) {
        iVar3 = 1;
        goto LAB_0064b10f;
      }
      if ((0xfffffffbfffffff9 < uVar1) || (uVar2 <= (uint)uVar1)) {
        __assert_fail("Agi_ObjIsAnd(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAgi.c"
                      ,0xcb,"int Agi_ManSuppSize_rec(Agi_Man_t *, int)");
      }
      iVar3 = Agi_ManSuppSize_rec(p,(uint)uVar1 >> 1);
      pwVar4 = p->pObjs;
      uVar7 = pwVar4[uVar7] >> 0x21;
      iVar6 = iVar6 + iVar3;
      puVar5 = p->pTravIds + uVar7;
      uVar2 = p->nTravIds;
    } while (*puVar5 != uVar2);
    iVar3 = 0;
LAB_0064b10f:
    iVar6 = iVar6 + iVar3;
  }
  return iVar6;
}

Assistant:

int Agi_ManSuppSize_rec( Agi_Man_t * p, int i )
{
    if ( p->pTravIds[i] == p->nTravIds )
        return 0;
    p->pTravIds[i] = p->nTravIds;
    if ( Agi_ObjIsCi(p, i) )
        return 1;
    assert( Agi_ObjIsAnd(p, i) );
    return Agi_ManSuppSize_rec( p, Agi_ObjVar0(p, i) ) +  Agi_ManSuppSize_rec( p, Agi_ObjVar1(p, i) );
}